

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

PktIn * pq_in_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  size_t *psVar1;
  PacketQueueBase *pPVar2;
  PacketQueueNode *pPVar3;
  size_t sVar4;
  PktIn *pPVar5;
  
  pPVar2 = (PacketQueueBase *)prev->next;
  if (pPVar2 == pqb) {
    pPVar5 = (PktIn *)0x0;
  }
  else {
    if (pop) {
      pPVar3 = (pPVar2->end).next;
      pPVar3->prev = (pPVar2->end).prev;
      ((pPVar2->end).prev)->next = pPVar3;
      psVar1 = &(pPVar2->end).formal_size;
      sVar4 = pqb->total_size - *psVar1;
      if (pqb->total_size < *psVar1) {
        __assert_fail("pqb->total_size >= node->formal_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                      ,0x56,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
      }
      pqb->total_size = sVar4;
      if ((sVar4 != 0) && ((PacketQueueBase *)(pqb->end).next == pqb)) {
        __assert_fail("pqb->end.next != &pqb->end || pqb->total_size == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                      ,0x5c,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
      }
      (pPVar2->end).prev = pktin_freeq_head.prev;
      (pPVar2->end).next = &pktin_freeq_head;
      pktin_freeq_head.prev = (PacketQueueNode *)pPVar2;
      ((pPVar2->end).prev)->next = (PacketQueueNode *)pPVar2;
      (pPVar2->end).on_free_queue = true;
      queue_idempotent_callback(&ic_pktin_free);
    }
    pPVar5 = (PktIn *)&pPVar2[-1].total_size;
  }
  return pPVar5;
}

Assistant:

static PktIn *pq_in_after(PacketQueueBase *pqb,
                          PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = pktin_freeq_head.prev;
        node->next = &pktin_freeq_head;
        node->next->prev = node;
        node->prev->next = node;
        node->on_free_queue = true;

        queue_idempotent_callback(&ic_pktin_free);
    }

    return container_of(node, PktIn, qnode);
}